

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::Instruction::PrettyPrint_abi_cxx11_
          (string *__return_storage_ptr__,Instruction *this,uint32_t options)

{
  spv_target_env sVar1;
  IRContext *pIVar2;
  Module *this_00;
  AssemblyGrammar *this_01;
  uint *puVar3;
  uint32_t *instCode;
  uint *instWordCount;
  uint32_t *code;
  undefined4 in_stack_ffffffffffffff6c;
  uint32_t in_stack_ffffffffffffff70;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inst_binary;
  vector<unsigned_int,_std::allocator<unsigned_int>_> module_binary;
  uint32_t options_local;
  Instruction *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &inst_binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pIVar2 = context(this);
  this_00 = IRContext::module(pIVar2);
  Module::ToBinary(this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &inst_binary.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,false);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  ToBinaryWithoutAttachedDebugInsts
            (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  pIVar2 = context(this);
  this_01 = IRContext::grammar(pIVar2);
  sVar1 = AssemblyGrammar::target_env(this_01);
  puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  instCode = (uint32_t *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  instWordCount =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  &inst_binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  code = (uint32_t *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &inst_binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  spvInstructionBinaryToText_abi_cxx11_
            (__return_storage_ptr__,(spvtools *)(ulong)sVar1,(spv_target_env)puVar3,instCode,
             (size_t)instWordCount,code,CONCAT44(in_stack_ffffffffffffff6c,options) | 0x20,
             in_stack_ffffffffffffff70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &inst_binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string Instruction::PrettyPrint(uint32_t options) const {
  // Convert the module to binary.
  std::vector<uint32_t> module_binary;
  context()->module()->ToBinary(&module_binary, /* skip_nop = */ false);

  // Convert the instruction to binary. This is used to identify the correct
  // stream of words to output from the module.
  std::vector<uint32_t> inst_binary;
  ToBinaryWithoutAttachedDebugInsts(&inst_binary);

  // Do not generate a header.
  return spvInstructionBinaryToText(
      context()->grammar().target_env(), inst_binary.data(), inst_binary.size(),
      module_binary.data(), module_binary.size(),
      options | SPV_BINARY_TO_TEXT_OPTION_NO_HEADER);
}